

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyUnitSection
          (DWARFVerifier *this,DWARFSection *S,DWARFSectionKind SectionKind)

{
  DWARFContext *pDVar1;
  DWARFDataExtractor DebugInfoData_00;
  bool bVar2;
  uint uVar3;
  DWARFObject *Obj;
  DWARFSection **ppDVar4;
  bool *pbVar5;
  raw_ostream *this_00;
  StringRef SVar6;
  undefined1 local_21a;
  bool local_219;
  undefined1 local_218 [8];
  StringRef local_210;
  StringRef local_200;
  DWARFDebugAbbrev *local_1f0;
  undefined1 local_1e8 [8];
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> local_1e0;
  undefined1 local_1d2;
  bool local_1d1;
  undefined1 local_1d0 [8];
  undefined1 local_1c8 [16];
  StringRef local_1b8;
  DWARFDebugAbbrev *local_1a8;
  undefined1 local_1a0 [8];
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> local_198;
  __uniq_ptr_impl<llvm::DWARFGdbIndex,_std::default_delete<llvm::DWARFGdbIndex>_> local_190;
  DWARFUnit *Unit;
  DWARFUnitHeader Header;
  undefined1 local_f8 [8];
  DWARFUnitVector CompileUnitVector;
  DWARFUnitVector TypeUnitVector;
  uint uStack_70;
  bool hasDIE;
  bool isHeaderChainValid;
  bool isUnitDWARF64;
  uint8_t UnitType;
  uint64_t UnitIdx;
  uint64_t Offset;
  uint64_t OffsetStart;
  undefined1 auStack_50 [4];
  uint NumDebugInfoErrors;
  DWARFDataExtractor DebugInfoData;
  DWARFObject *DObj;
  DWARFSectionKind SectionKind_local;
  DWARFSection *S_local;
  DWARFVerifier *this_local;
  
  Obj = DWARFContext::getDWARFObj(this->DCtx);
  DebugInfoData.Section = (DWARFSection *)Obj;
  bVar2 = DWARFContext::isLittleEndian(this->DCtx);
  DWARFDataExtractor::DWARFDataExtractor((DWARFDataExtractor *)auStack_50,Obj,S,bVar2,'\0');
  OffsetStart._4_4_ = 0;
  Offset = 0;
  UnitIdx = 0;
  _uStack_70 = (DWARFObject *)0x0;
  TypeUnitVector._63_1_ = 0;
  TypeUnitVector._62_1_ = 0;
  TypeUnitVector._61_1_ = 1;
  TypeUnitVector._60_1_ = DataExtractor::isValidOffset((DataExtractor *)auStack_50,0);
  DWARFUnitVector::DWARFUnitVector((DWARFUnitVector *)&CompileUnitVector.NumInfoUnits);
  DWARFUnitVector::DWARFUnitVector((DWARFUnitVector *)local_f8);
  while ((TypeUnitVector._60_1_ & 1) != 0) {
    Offset = UnitIdx;
    Header._72_8_ = _auStack_50;
    DebugInfoData_00.super_DataExtractor.Data.Length =
         (size_t)DebugInfoData.super_DataExtractor.Data.Data;
    DebugInfoData_00.super_DataExtractor.Data.Data = _auStack_50;
    DebugInfoData_00.super_DataExtractor.IsLittleEndian =
         (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
    DebugInfoData_00.super_DataExtractor.AddressSize =
         DebugInfoData.super_DataExtractor.Data.Length._1_1_;
    DebugInfoData_00.super_DataExtractor._18_6_ =
         DebugInfoData.super_DataExtractor.Data.Length._2_6_;
    DebugInfoData_00.Obj = (DWARFObject *)DebugInfoData.super_DataExtractor._16_8_;
    DebugInfoData_00.Section = (DWARFSection *)DebugInfoData.Obj;
    bVar2 = verifyUnitHeader(this,DebugInfoData_00,&UnitIdx,uStack_70,&TypeUnitVector.field_0x3f,
                             (bool *)&TypeUnitVector.field_0x3e);
    if (bVar2) {
      DWARFUnitHeader::DWARFUnitHeader((DWARFUnitHeader *)&Unit);
      DWARFUnitHeader::extract
                ((DWARFUnitHeader *)&Unit,this->DCtx,(DWARFDataExtractor *)auStack_50,&Offset,
                 SectionKind,(DWARFUnitIndex *)0x0,(Entry *)0x0);
      uVar3 = (uint)(byte)TypeUnitVector._63_1_;
      if (uVar3 < 2) {
LAB_020600ca:
        pDVar1 = this->DCtx;
        local_1f0 = DWARFContext::getDebugAbbrev(pDVar1);
        local_200.Length = (**(code **)(((DebugInfoData.Section)->Data).Data + 0x90))();
        local_200.Data = (char *)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x50))();
        SVar6 = (StringRef)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x88))();
        local_210 = SVar6;
        ppDVar4 = (DWARFSection **)(**(code **)(((DebugInfoData.Section)->Data).Data + 200))();
        local_218 = (undefined1  [8])(**(code **)(((DebugInfoData.Section)->Data).Data + 0x140))();
        pbVar5 = (bool *)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x78))();
        local_219 = DWARFContext::isLittleEndian(this->DCtx);
        local_21a = 0;
        std::
        make_unique<llvm::DWARFCompileUnit,llvm::DWARFContext&,llvm::DWARFSection_const&,llvm::DWARFUnitHeader&,llvm::DWARFDebugAbbrev_const*,llvm::DWARFSection_const*,llvm::DWARFSection_const*,llvm::StringRef,llvm::DWARFSection_const&,llvm::DWARFSection_const*,llvm::DWARFSection_const&,bool,bool,llvm::DWARFUnitVector&>
                  ((DWARFContext *)local_1e8,(DWARFSection *)pDVar1,(DWARFUnitHeader *)S,
                   (DWARFDebugAbbrev **)&Unit,(DWARFSection **)&local_1f0,
                   (DWARFSection **)&local_200.Length,&local_200,(DWARFSection *)&local_210,ppDVar4,
                   (DWARFSection *)local_218,pbVar5,&local_219,(DWARFUnitVector *)&local_21a);
        std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>::
        unique_ptr<llvm::DWARFCompileUnit,std::default_delete<llvm::DWARFCompileUnit>,void>
                  ((unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>> *)&local_1e0,
                   (unique_ptr<llvm::DWARFCompileUnit,_std::default_delete<llvm::DWARFCompileUnit>_>
                    *)local_1e8);
        local_190._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>.
        super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>._M_head_impl =
             (tuple<llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>)
             DWARFUnitVector::addUnit((DWARFUnitVector *)local_f8,&local_1e0);
        std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::~unique_ptr
                  (&local_1e0);
        std::unique_ptr<llvm::DWARFCompileUnit,_std::default_delete<llvm::DWARFCompileUnit>_>::
        ~unique_ptr((unique_ptr<llvm::DWARFCompileUnit,_std::default_delete<llvm::DWARFCompileUnit>_>
                     *)local_1e8);
      }
      else {
        if (uVar3 != 2) {
          if (uVar3 - 3 < 3) goto LAB_020600ca;
          if (uVar3 != 6) {
            llvm_unreachable_internal
                      ("Invalid UnitType.",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                       ,0x141);
          }
        }
        pDVar1 = this->DCtx;
        local_1a8 = DWARFContext::getDebugAbbrev(pDVar1);
        local_1b8.Length = (**(code **)(((DebugInfoData.Section)->Data).Data + 0x90))();
        local_1b8.Data = (char *)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x50))();
        SVar6 = (StringRef)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x88))();
        local_1c8 = (undefined1  [16])SVar6;
        ppDVar4 = (DWARFSection **)(**(code **)(((DebugInfoData.Section)->Data).Data + 200))();
        local_1d0 = (undefined1  [8])(**(code **)(((DebugInfoData.Section)->Data).Data + 0x140))();
        pbVar5 = (bool *)(**(code **)(((DebugInfoData.Section)->Data).Data + 0x78))();
        local_1d1 = DWARFContext::isLittleEndian(this->DCtx);
        local_1d2 = 0;
        std::
        make_unique<llvm::DWARFTypeUnit,llvm::DWARFContext&,llvm::DWARFSection_const&,llvm::DWARFUnitHeader&,llvm::DWARFDebugAbbrev_const*,llvm::DWARFSection_const*,llvm::DWARFSection_const*,llvm::StringRef,llvm::DWARFSection_const&,llvm::DWARFSection_const*,llvm::DWARFSection_const&,bool,bool,llvm::DWARFUnitVector&>
                  ((DWARFContext *)local_1a0,(DWARFSection *)pDVar1,(DWARFUnitHeader *)S,
                   (DWARFDebugAbbrev **)&Unit,(DWARFSection **)&local_1a8,
                   (DWARFSection **)&local_1b8.Length,&local_1b8,(DWARFSection *)local_1c8,ppDVar4,
                   (DWARFSection *)local_1d0,pbVar5,&local_1d1,(DWARFUnitVector *)&local_1d2);
        std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>::
        unique_ptr<llvm::DWARFTypeUnit,std::default_delete<llvm::DWARFTypeUnit>,void>
                  ((unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>> *)&local_198,
                   (unique_ptr<llvm::DWARFTypeUnit,_std::default_delete<llvm::DWARFTypeUnit>_> *)
                   local_1a0);
        local_190._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>.
        super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>._M_head_impl =
             (tuple<llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>)
             DWARFUnitVector::addUnit((DWARFUnitVector *)&CompileUnitVector.NumInfoUnits,&local_198)
        ;
        std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::~unique_ptr
                  (&local_198);
        std::unique_ptr<llvm::DWARFTypeUnit,_std::default_delete<llvm::DWARFTypeUnit>_>::~unique_ptr
                  ((unique_ptr<llvm::DWARFTypeUnit,_std::default_delete<llvm::DWARFTypeUnit>_> *)
                   local_1a0);
      }
      uVar3 = verifyUnitContents(this,(DWARFUnit *)
                                      local_190._M_t.
                                      super__Tuple_impl<0UL,_llvm::DWARFGdbIndex_*,_std::default_delete<llvm::DWARFGdbIndex>_>
                                      .super__Head_base<0UL,_llvm::DWARFGdbIndex_*,_false>.
                                      _M_head_impl);
      OffsetStart._4_4_ = uVar3 + OffsetStart._4_4_;
    }
    else {
      TypeUnitVector._61_1_ = 0;
      if ((TypeUnitVector._62_1_ & 1) != 0) break;
    }
    TypeUnitVector._60_1_ = DataExtractor::isValidOffset((DataExtractor *)auStack_50,UnitIdx);
    _uStack_70 = (DWARFObject *)((long)&_uStack_70->_vptr_DWARFObject + 1);
  }
  if (((tuple<const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>)_uStack_70
       == (_Head_base<0UL,_const_llvm::DWARFObject_*,_false>)0x0) &&
     ((TypeUnitVector._60_1_ & 1) == 0)) {
    this_00 = warn(this);
    raw_ostream::operator<<(this_00,"Section is empty.\n");
    TypeUnitVector._61_1_ = 1;
  }
  if ((TypeUnitVector._61_1_ & 1) == 0) {
    OffsetStart._4_4_ = OffsetStart._4_4_ + 1;
  }
  uVar3 = verifyDebugInfoReferences(this);
  uVar3 = uVar3 + OffsetStart._4_4_;
  OffsetStart._4_4_ = uVar3;
  DWARFUnitVector::~DWARFUnitVector((DWARFUnitVector *)local_f8);
  DWARFUnitVector::~DWARFUnitVector((DWARFUnitVector *)&CompileUnitVector.NumInfoUnits);
  return uVar3;
}

Assistant:

unsigned DWARFVerifier::verifyUnitSection(const DWARFSection &S,
                                          DWARFSectionKind SectionKind) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  DWARFDataExtractor DebugInfoData(DObj, S, DCtx.isLittleEndian(), 0);
  unsigned NumDebugInfoErrors = 0;
  uint64_t OffsetStart = 0, Offset = 0, UnitIdx = 0;
  uint8_t UnitType = 0;
  bool isUnitDWARF64 = false;
  bool isHeaderChainValid = true;
  bool hasDIE = DebugInfoData.isValidOffset(Offset);
  DWARFUnitVector TypeUnitVector;
  DWARFUnitVector CompileUnitVector;
  while (hasDIE) {
    OffsetStart = Offset;
    if (!verifyUnitHeader(DebugInfoData, &Offset, UnitIdx, UnitType,
                          isUnitDWARF64)) {
      isHeaderChainValid = false;
      if (isUnitDWARF64)
        break;
    } else {
      DWARFUnitHeader Header;
      Header.extract(DCtx, DebugInfoData, &OffsetStart, SectionKind);
      DWARFUnit *Unit;
      switch (UnitType) {
      case dwarf::DW_UT_type:
      case dwarf::DW_UT_split_type: {
        Unit = TypeUnitVector.addUnit(std::make_unique<DWARFTypeUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            TypeUnitVector));
        break;
      }
      case dwarf::DW_UT_skeleton:
      case dwarf::DW_UT_split_compile:
      case dwarf::DW_UT_compile:
      case dwarf::DW_UT_partial:
      // UnitType = 0 means that we are verifying a compile unit in DWARF v4.
      case 0: {
        Unit = CompileUnitVector.addUnit(std::make_unique<DWARFCompileUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            CompileUnitVector));
        break;
      }
      default: { llvm_unreachable("Invalid UnitType."); }
      }
      NumDebugInfoErrors += verifyUnitContents(*Unit);
    }
    hasDIE = DebugInfoData.isValidOffset(Offset);
    ++UnitIdx;
  }
  if (UnitIdx == 0 && !hasDIE) {
    warn() << "Section is empty.\n";
    isHeaderChainValid = true;
  }
  if (!isHeaderChainValid)
    ++NumDebugInfoErrors;
  NumDebugInfoErrors += verifyDebugInfoReferences();
  return NumDebugInfoErrors;
}